

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

shared_ptr<std::valarray<float>_> __thiscall
notch::core::ActivationLayer::getInputBuffer(ActivationLayer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<std::valarray<float>_> sVar1;
  ActivationLayer *this_local;
  
  std::shared_ptr<std::valarray<float>_>::shared_ptr
            ((shared_ptr<std::valarray<float>_> *)this,
             (shared_ptr<std::valarray<float>_> *)(in_RSI + 8));
  sVar1.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<std::valarray<float>_>)
         sVar1.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Array> getInputBuffer() { return shared.inputBuffer; }